

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,QPoint args_4,
               QPoint args_5,int args_6,Orientation args_7,QFlags<Qt::KeyboardModifier> args_8,
               ScrollPhase args_9,MouseEventSource args_10,bool args_11,QPointingDevice *args_12)

{
  QPoint args_5_00;
  QPointF args_3_00;
  QPointF args_2_00;
  QPoint args_5_01;
  QPointF args_3_01;
  QPointF args_2_01;
  QPoint in_RCX;
  qreal in_RDX;
  MouseEventSource unaff_EBX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qreal in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  QWindow *in_XMM2_Qa;
  qreal in_XMM3_Qa;
  QPointingDevice *unaff_retaddr;
  Representation in_stack_00000008;
  ScrollPhase in_stack_000000a8;
  MouseEventSource in_stack_000000b0;
  QPointingDevice *in_stack_000000c0;
  undefined1 local_e9;
  Orientation in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  unsigned_long in_stack_ffffffffffffff48;
  QWindow *in_stack_ffffffffffffff50;
  Representation in_stack_ffffffffffffff78;
  Representation in_stack_ffffffffffffff7c;
  QPoint in_stack_ffffffffffffff80;
  qreal in_stack_ffffffffffffff88;
  qreal in_stack_ffffffffffffff90;
  qreal in_stack_ffffffffffffff98;
  qreal in_stack_ffffffffffffffa0;
  QFlags<Qt::KeyboardModifier> args_8_00;
  Representation in_stack_ffffffffffffffb0;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_8_00.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = SUB84((ulong)in_XMM1_Qa >> 0x20,0);
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    args_2_01.yp = in_XMM0_Qa;
    args_2_01.xp = in_XMM3_Qa;
    args_3_01.yp = (qreal)in_XMM2_Qa;
    args_3_01.xp = in_RDX;
    args_5_01.yp.m_i = in_stack_00000008.m_i;
    args_5_01.xp.m_i = in_stack_ffffffffffffffb0.m_i;
    local_e9 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
               handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,args_2_01,args_3_01,
                          in_RCX,args_5_01,in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                          args_8_00,in_stack_000000a8,in_stack_000000b0,
                          SUB81((ulong)in_RDI >> 0x38,0),in_stack_000000c0);
  }
  else {
    args_2_00.yp = in_stack_ffffffffffffffa0;
    args_2_00.xp = in_stack_ffffffffffffff98;
    args_3_00.yp = in_stack_ffffffffffffff90;
    args_3_00.xp = in_stack_ffffffffffffff88;
    args_5_00.yp.m_i = in_stack_ffffffffffffff7c.m_i;
    args_5_00.xp.m_i = in_stack_ffffffffffffff78.m_i;
    local_e9 = QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
               handleEvent<QWindowSystemInterfacePrivate::WheelEvent,QWindow*,unsigned_long,QPointF,QPointF,QPoint,QPoint,int,Qt::Orientation,QFlags<Qt::KeyboardModifier>,Qt::ScrollPhase,Qt::MouseEventSource,bool,QPointingDevice_const*>
                         (in_XMM2_Qa,(unsigned_long)in_RDX,args_2_00,args_3_00,
                          in_stack_ffffffffffffff80,args_5_00,in_RCX.yp.m_i.m_i,in_RCX.xp.m_i.m_i,
                          args_8_00,(ScrollPhase)lVar1,unaff_EBX,
                          SUB41((uint)in_stack_00000008.m_i >> 0x18,0),unaff_retaddr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_e9;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}